

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xInstPrinter.c
# Opt level: O3

void TMS320C64x_printInst(MCInst *MI,SStream *O,void *Info)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  MCOperand *pMVar5;
  int64_t iVar6;
  SStream *O_00;
  SStream *extraout_RDX;
  SStream *extraout_RDX_00;
  SStream *extraout_RDX_01;
  SStream *extraout_RDX_02;
  SStream *extraout_RDX_03;
  SStream *extraout_RDX_04;
  SStream *pSVar7;
  char *pcVar8;
  ulong uVar9;
  
  uVar2 = MCInst_getOpcode(MI);
  if ((int)uVar2 < 0x102) {
    uVar3 = uVar2 - 0xa2;
    if (uVar3 < 0x13) {
      if ((0xa8U >> (uVar3 & 0x1f) & 1) != 0) {
LAB_00258107:
        uVar3 = MCInst_getNumOperands(MI);
        if (uVar3 == 3) {
          pMVar5 = MCInst_getOperand(MI,0);
          _Var1 = MCOperand_isReg(pMVar5);
          if (_Var1) {
            pMVar5 = MCInst_getOperand(MI,1);
            _Var1 = MCOperand_isReg(pMVar5);
            if (_Var1) {
              pMVar5 = MCInst_getOperand(MI,2);
              _Var1 = MCOperand_isImm(pMVar5);
              if (_Var1) {
                pMVar5 = MCInst_getOperand(MI,2);
                iVar6 = MCOperand_getImm(pMVar5);
                if (iVar6 == 0) {
                  MCInst_setOpcodePub(MI,0x8c);
                  MI->size = MI->size + 0xff;
                  pcVar8 = "MV\t";
                  goto LAB_002585d5;
                }
              }
            }
          }
        }
        if (1 < uVar2 - 0xa0) {
          if (uVar2 != 0xa2) goto LAB_002582df;
LAB_00258197:
          uVar2 = MCInst_getNumOperands(MI);
          if (uVar2 == 1) {
            pMVar5 = MCInst_getOperand(MI,0);
            _Var1 = MCOperand_isImm(pMVar5);
            if (_Var1) {
              pMVar5 = MCInst_getOperand(MI,0);
              uVar2 = MCOperand_getReg(pMVar5);
              if (uVar2 == 0x10) {
                MCInst_setOpcodePub(MI,0x8b);
                MI->size = MI->size + 0xff;
                pcVar8 = "IDLE";
                goto LAB_002582cf;
              }
            }
          }
          uVar2 = MCInst_getNumOperands(MI);
          if (uVar2 == 1) {
            pMVar5 = MCInst_getOperand(MI,0);
            _Var1 = MCOperand_isImm(pMVar5);
            if (_Var1) {
              pMVar5 = MCInst_getOperand(MI,0);
              uVar2 = MCOperand_getReg(pMVar5);
              if (uVar2 == 1) {
                MI->size = MI->size + 0xff;
                pcVar8 = "NOP";
LAB_002582cf:
                SStream_concat0(O,pcVar8);
                return;
              }
            }
          }
          goto LAB_002582df;
        }
        goto LAB_0025820b;
      }
      if ((0x60000U >> (uVar3 & 0x1f) & 1) == 0) {
        if (uVar3 != 0) goto LAB_00257d3f;
        goto LAB_00258197;
      }
      uVar2 = MCInst_getNumOperands(MI);
      if (uVar2 != 3) goto LAB_002582df;
      pMVar5 = MCInst_getOperand(MI,0);
      _Var1 = MCOperand_isReg(pMVar5);
      if (!_Var1) goto LAB_002582df;
      pMVar5 = MCInst_getOperand(MI,1);
      _Var1 = MCOperand_isReg(pMVar5);
      if (!_Var1) goto LAB_002582df;
      pMVar5 = MCInst_getOperand(MI,2);
      _Var1 = MCOperand_isReg(pMVar5);
      if (!_Var1) goto LAB_002582df;
      pMVar5 = MCInst_getOperand(MI,1);
      uVar2 = MCOperand_getReg(pMVar5);
      pMVar5 = MCInst_getOperand(MI,2);
      uVar3 = MCOperand_getReg(pMVar5);
      if (uVar2 != uVar3) goto LAB_002582df;
      MCInst_setOpcodePub(MI,0x8f);
      MI->size = MI->size + 0xff;
      pcVar8 = "SWAP2\t";
LAB_002585d5:
      SStream_concat0(O,pcVar8);
      uVar2 = 1;
      goto LAB_002585e5;
    }
LAB_00257d3f:
    if (0x32 < uVar2) {
LAB_002581fa:
      if (1 < uVar2 - 0xa0) goto LAB_002582df;
LAB_0025820b:
      uVar2 = MCInst_getNumOperands(MI);
      if (uVar2 == 2) {
        pMVar5 = MCInst_getOperand(MI,0);
        _Var1 = MCOperand_isReg(pMVar5);
        if (_Var1) {
          pMVar5 = MCInst_getOperand(MI,1);
          _Var1 = MCOperand_isImm(pMVar5);
          if (_Var1) {
            pMVar5 = MCInst_getOperand(MI,1);
            iVar6 = MCOperand_getImm(pMVar5);
            if (iVar6 == 0) {
              MCInst_setOpcodePub(MI,0x90);
              MI->size = MI->size + 0xff;
              goto LAB_0025827e;
            }
          }
        }
      }
      goto LAB_002582df;
    }
    uVar9 = (ulong)uVar2;
    if ((0x4680000000000U >> (uVar9 & 0x3f) & 1) == 0) {
      if (uVar9 == 0x29) goto LAB_00258107;
      goto LAB_002581fa;
    }
    uVar3 = MCInst_getNumOperands(MI);
    if (uVar3 != 3) {
LAB_00257dd3:
      if ((0x32 < uVar2) || ((0x4600000000000U >> (uVar9 & 0x3f) & 1) == 0)) goto LAB_002582df;
      goto LAB_00258107;
    }
    pMVar5 = MCInst_getOperand(MI,0);
    _Var1 = MCOperand_isReg(pMVar5);
    if (!_Var1) goto LAB_00257dd3;
    pMVar5 = MCInst_getOperand(MI,1);
    _Var1 = MCOperand_isReg(pMVar5);
    if (!_Var1) goto LAB_00257dd3;
    pMVar5 = MCInst_getOperand(MI,2);
    _Var1 = MCOperand_isImm(pMVar5);
    if (!_Var1) goto LAB_00257dd3;
    pMVar5 = MCInst_getOperand(MI,2);
    iVar6 = MCOperand_getImm(pMVar5);
    if (-1 < iVar6) goto LAB_00257dd3;
    MCInst_setOpcodePub(MI,0x7c);
    pMVar5 = MCInst_getOperand(MI,2);
    iVar6 = MCOperand_getImm(pMVar5);
    MCOperand_setImm(pMVar5,-iVar6);
    SStream_concat0(O,"SUB\t");
    printOperand(MI,1,O);
    pcVar8 = ", ";
    SStream_concat0(O,", ");
    printOperand(MI,2,O);
LAB_002585f7:
    SStream_concat0(O,pcVar8);
switchD_00258487_caseD_1:
    uVar2 = 0;
  }
  else {
    uVar3 = uVar2 - 0x102;
    if (0x12 < uVar3) goto LAB_002582df;
    if ((0x43U >> (uVar3 & 0x1f) & 1) == 0) {
      if ((0x54000U >> (uVar3 & 0x1f) & 1) == 0) {
        if ((0x84U >> (uVar3 & 0x1f) & 1) == 0) goto LAB_002582df;
        uVar3 = MCInst_getNumOperands(MI);
        if (uVar3 != 3) {
LAB_00258043:
          if (uVar2 == 0x108) goto LAB_00258050;
          goto LAB_002582df;
        }
        pMVar5 = MCInst_getOperand(MI,0);
        _Var1 = MCOperand_isReg(pMVar5);
        if (!_Var1) goto LAB_00258043;
        pMVar5 = MCInst_getOperand(MI,1);
        _Var1 = MCOperand_isReg(pMVar5);
        if (!_Var1) goto LAB_00258043;
        pMVar5 = MCInst_getOperand(MI,2);
        _Var1 = MCOperand_isReg(pMVar5);
        if (!_Var1) goto LAB_00258043;
        pMVar5 = MCInst_getOperand(MI,1);
        uVar3 = MCOperand_getReg(pMVar5);
        pMVar5 = MCInst_getOperand(MI,2);
        uVar4 = MCOperand_getReg(pMVar5);
        if (uVar3 != uVar4) goto LAB_00258043;
        MCInst_setOpcodePub(MI,0x90);
        MI->size = MI->size + 0xfe;
LAB_0025827e:
        pcVar8 = "ZERO\t";
        goto LAB_002585f7;
      }
      uVar2 = MCInst_getNumOperands(MI);
      if (uVar2 == 3) {
        pMVar5 = MCInst_getOperand(MI,0);
        _Var1 = MCOperand_isReg(pMVar5);
        if (_Var1) {
          pMVar5 = MCInst_getOperand(MI,1);
          _Var1 = MCOperand_isReg(pMVar5);
          if (_Var1) {
            pMVar5 = MCInst_getOperand(MI,2);
            _Var1 = MCOperand_isImm(pMVar5);
            if (_Var1) {
              pMVar5 = MCInst_getOperand(MI,2);
              iVar6 = MCOperand_getImm(pMVar5);
              if (iVar6 == -1) {
                MCInst_setOpcodePub(MI,0x8e);
                MI->size = MI->size + 0xff;
                pcVar8 = "NOT\t";
                goto LAB_002585d5;
              }
            }
          }
        }
      }
    }
    else {
LAB_00258050:
      uVar2 = MCInst_getNumOperands(MI);
      if (uVar2 == 3) {
        pMVar5 = MCInst_getOperand(MI,0);
        _Var1 = MCOperand_isReg(pMVar5);
        if (_Var1) {
          pMVar5 = MCInst_getOperand(MI,1);
          _Var1 = MCOperand_isReg(pMVar5);
          if (_Var1) {
            pMVar5 = MCInst_getOperand(MI,2);
            _Var1 = MCOperand_isImm(pMVar5);
            if (_Var1) {
              pMVar5 = MCInst_getOperand(MI,2);
              iVar6 = MCOperand_getImm(pMVar5);
              if (iVar6 == 0) {
                MCInst_setOpcodePub(MI,0x8d);
                MI->size = MI->size + 0xff;
                pcVar8 = "NEG\t";
                goto LAB_002585d5;
              }
            }
          }
        }
      }
    }
LAB_002582df:
    uVar2 = MCInst_getOpcode(MI);
    uVar2 = *(uint *)(printInstruction_OpInfo + (ulong)uVar2 * 4);
    SStream_concat0(O,(char *)((ulong)(uVar2 & 0x3ff) + 0x68a8bf));
    uVar3 = (uint)O;
    switch(uVar2 >> 10 & 7) {
    case 0:
      goto switchD_00258329_caseD_0;
    case 1:
      printOperand(MI,1,O);
      SStream_concat0(O,", ");
      switch(uVar2 >> 0xd & 7) {
      default:
        goto switchD_00258462_caseD_0;
      case 1:
        goto switchD_00258462_caseD_1;
      case 2:
switchD_00258462_caseD_2:
        printOperand(MI,1,O);
        SStream_concat0(O,", ");
        pSVar7 = extraout_RDX_01;
        switch(uVar2 >> 0x10 & 7) {
        case 0:
          goto switchD_00258329_caseD_0;
        case 1:
          goto switchD_00258487_caseD_1;
        case 3:
          goto switchD_00258462_caseD_1;
        case 4:
          goto switchD_00258487_caseD_4;
        case 5:
          goto switchD_00258487_caseD_5;
        case 6:
          goto switchD_00258487_caseD_6;
        case 7:
          goto switchD_00258487_caseD_7;
        }
        goto switchD_00258487_caseD_2;
      case 3:
switchD_00258462_caseD_3:
        printOperand(MI,2,O);
        SStream_concat0(O,", ");
        pSVar7 = extraout_RDX_03;
        switch(uVar2 >> 0x10 & 7) {
        case 0:
          goto switchD_00258329_caseD_0;
        case 2:
          goto switchD_00258487_caseD_2;
        case 3:
          goto switchD_00258462_caseD_1;
        case 4:
          goto switchD_00258487_caseD_4;
        case 5:
          goto switchD_00258487_caseD_5;
        case 6:
          goto switchD_00258487_caseD_6;
        case 7:
          goto switchD_00258487_caseD_7;
        }
        break;
      case 4:
switchD_00258462_caseD_4:
        printRegPair(MI,1,O);
        SStream_concat0(O,", ");
        pSVar7 = extraout_RDX_04;
        switch(uVar2 >> 0x10 & 7) {
        case 0:
          goto switchD_00258329_caseD_0;
        case 2:
          goto switchD_00258487_caseD_2;
        case 3:
          goto switchD_00258462_caseD_1;
        case 4:
          goto switchD_00258487_caseD_4;
        case 5:
          goto switchD_00258487_caseD_5;
        case 6:
          goto switchD_00258487_caseD_6;
        case 7:
          goto switchD_00258487_caseD_7;
        }
        break;
      case 5:
switchD_00258462_caseD_5:
        SStream_concat0(O,", ");
        pSVar7 = extraout_RDX_02;
        switch(uVar2 >> 0x10 & 7) {
        case 0:
          goto switchD_00258329_caseD_0;
        case 2:
          goto switchD_00258487_caseD_2;
        case 3:
          goto switchD_00258462_caseD_1;
        case 4:
          goto switchD_00258487_caseD_4;
        case 5:
          goto switchD_00258487_caseD_5;
        case 6:
          goto switchD_00258487_caseD_6;
        case 7:
          goto switchD_00258487_caseD_7;
        }
        break;
      case 6:
        goto switchD_00258329_caseD_0;
      }
      goto switchD_00258487_caseD_1;
    case 2:
      printRegPair(MI,1,O);
      SStream_concat0(O,", ");
      switch(uVar2 >> 0xd & 7) {
      case 1:
        goto switchD_00258462_caseD_1;
      case 2:
        goto switchD_00258462_caseD_2;
      case 3:
        goto switchD_00258462_caseD_3;
      case 4:
        goto switchD_00258462_caseD_4;
      case 5:
        goto switchD_00258462_caseD_5;
      case 6:
        goto switchD_00258329_caseD_0;
      }
      break;
    case 3:
      printOperand(MI,2,O);
      SStream_concat0(O,", ");
      switch(uVar2 >> 0xd & 7) {
      case 1:
        goto switchD_00258462_caseD_1;
      case 2:
        goto switchD_00258462_caseD_2;
      case 3:
        goto switchD_00258462_caseD_3;
      case 4:
        goto switchD_00258462_caseD_4;
      case 5:
        goto switchD_00258462_caseD_5;
      case 6:
        goto switchD_00258329_caseD_0;
      }
      break;
    case 4:
      printOperand(MI,0,O);
      switch(uVar2 >> 0xd & 7) {
      case 1:
        goto switchD_00258462_caseD_1;
      case 2:
        goto switchD_00258462_caseD_2;
      case 3:
        goto switchD_00258462_caseD_3;
      case 4:
        goto switchD_00258462_caseD_4;
      case 5:
        goto switchD_00258462_caseD_5;
      case 6:
        goto switchD_00258329_caseD_0;
      }
      break;
    case 5:
      printMemOperand(MI,uVar3,O_00);
      SStream_concat0(O,", ");
      switch(uVar2 >> 0xd & 7) {
      case 1:
        goto switchD_00258462_caseD_1;
      case 2:
        goto switchD_00258462_caseD_2;
      case 3:
        goto switchD_00258462_caseD_3;
      case 4:
        goto switchD_00258462_caseD_4;
      case 5:
        goto switchD_00258462_caseD_5;
      case 6:
        goto switchD_00258329_caseD_0;
      }
      break;
    case 6:
      printMemOperand2(MI,uVar3,O_00);
      goto LAB_002585ed;
    case 7:
      printRegPair(MI,0,O);
      SStream_concat0(O,", ");
      pSVar7 = extraout_RDX;
      goto switchD_00258487_caseD_6;
    }
switchD_00258462_caseD_0:
    printOperand(MI,0,O);
    pSVar7 = extraout_RDX_00;
    switch(uVar2 >> 0x10 & 7) {
    case 0:
switchD_00258329_caseD_0:
      return;
    case 1:
      goto switchD_00258487_caseD_1;
    case 2:
switchD_00258487_caseD_2:
      SStream_concat0(O,", ");
      uVar2 = 2;
      break;
    case 3:
switchD_00258462_caseD_1:
      printRegPair(MI,0,O);
      return;
    case 4:
switchD_00258487_caseD_4:
      uVar2 = 1;
      break;
    case 5:
switchD_00258487_caseD_5:
      uVar2 = 3;
LAB_002585e5:
      printOperand(MI,uVar2,O);
LAB_002585ed:
      pcVar8 = ", ";
      goto LAB_002585f7;
    case 6:
switchD_00258487_caseD_6:
      printMemOperand(MI,uVar3,pSVar7);
      return;
    case 7:
switchD_00258487_caseD_7:
      printMemOperand2(MI,uVar3,pSVar7);
      return;
    }
  }
  printOperand(MI,uVar2,O);
  return;
}

Assistant:

void TMS320C64x_printInst(MCInst *MI, SStream *O, void *Info)
{
	if (!printAliasInstruction(MI, O, Info))
		printInstruction(MI, O, Info);
}